

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

void __thiscall tokenizer::add_token_to_stream(tokenizer *this,Token_Type type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Token new_token;
  value_type local_40;
  
  paVar1 = &local_40.value.field_2;
  local_40.value._M_string_length = 0;
  local_40.value.field_2._M_local_buf[0] = '\0';
  local_40.line_number = this->last_line_number;
  local_40.position_number = this->last_position_number;
  local_40.type = type;
  local_40.value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_40.value,&this->current_word);
  std::vector<Token,_std::allocator<Token>_>::push_back(this->token_stream,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.value._M_dataplus._M_p,
                    CONCAT71(local_40.value.field_2._M_allocated_capacity._1_7_,
                             local_40.value.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void tokenizer::add_token_to_stream(Token_Type type) {
    Token new_token;
    new_token.type = type;
    new_token.line_number = this->last_line_number;
    new_token.position_number = this->last_position_number;
    new_token.value = this->current_word;

    this->token_stream->push_back(new_token);
}